

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::_set_val(Tree *this,size_t node,csubstr val,type_bits more_flags)

{
  Location loc;
  Location loc_00;
  bool bVar1;
  error_flags eVar2;
  size_t sVar3;
  NodeData *pNVar4;
  size_t in_RCX;
  char *in_RDX;
  size_t in_RSI;
  undefined8 in_R8;
  Tree *in_stack_ffffffffffffff28;
  size_t in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  Tree *in_stack_ffffffffffffff40;
  Tree *in_stack_ffffffffffffff48;
  char *local_98;
  Tree *pTStack_90;
  Tree *in_stack_ffffffffffffff78;
  Tree *in_stack_ffffffffffffff80;
  size_t sStack_78;
  char *in_stack_ffffffffffffff90;
  Tree *in_stack_ffffffffffffff98;
  Tree *in_stack_ffffffffffffffa0;
  
  sVar3 = num_children(in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38);
  if (sVar3 != 0) {
    eVar2 = get_error_flags();
    in_stack_ffffffffffffff48 = in_stack_ffffffffffffffa0;
    if (((eVar2 & 1) != 0) &&
       (bVar1 = is_debugger_attached(), in_stack_ffffffffffffff48 = in_stack_ffffffffffffffa0, bVar1
       )) {
      trap_instruction();
      in_stack_ffffffffffffff48 = in_stack_ffffffffffffffa0;
    }
    Location::Location((Location *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                       in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28);
    in_stack_ffffffffffffff40 = in_stack_ffffffffffffff98;
    in_stack_ffffffffffffff38 = in_stack_ffffffffffffff90;
    in_stack_ffffffffffffff28 = in_stack_ffffffffffffff80;
    loc.super_LineCol.line = (size_t)in_stack_ffffffffffffff40;
    loc.super_LineCol.offset = (size_t)in_stack_ffffffffffffff38;
    loc.super_LineCol.col = (size_t)in_stack_ffffffffffffff48;
    loc.name.str = (char *)in_R8;
    loc.name.len = in_RSI;
    in_stack_ffffffffffffff80 = in_stack_ffffffffffffff28;
    in_stack_ffffffffffffff90 = in_stack_ffffffffffffff38;
    in_stack_ffffffffffffff98 = in_stack_ffffffffffffff40;
    in_stack_ffffffffffffffa0 = in_stack_ffffffffffffff48;
    error<38ul>((char (*) [38])in_stack_ffffffffffffff28,loc);
    in_stack_ffffffffffffff30 = sStack_78;
  }
  pNVar4 = _p(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
  if ((((pNVar4->m_type).type & SEQ) != NOTYPE) ||
     (pNVar4 = _p(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78),
     ((pNVar4->m_type).type & MAP) != NOTYPE)) {
    in_stack_ffffffffffffff48 = in_stack_ffffffffffffff78;
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    Location::Location((Location *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                       in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28);
    loc_00.super_LineCol.line = (size_t)in_stack_ffffffffffffff98;
    loc_00.super_LineCol.offset = (size_t)in_stack_ffffffffffffff90;
    loc_00.super_LineCol.col = (size_t)in_stack_ffffffffffffffa0;
    loc_00.name.str = (char *)in_R8;
    loc_00.name.len = in_RSI;
    in_stack_ffffffffffffff78 = in_stack_ffffffffffffff48;
    error<45ul>((char (*) [45])in_stack_ffffffffffffff80,loc_00);
    in_stack_ffffffffffffff38 = local_98;
    in_stack_ffffffffffffff40 = pTStack_90;
  }
  pNVar4 = _p(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
  (pNVar4->m_val).scalar.str = in_RDX;
  (pNVar4->m_val).scalar.len = in_RCX;
  _add_flags(in_stack_ffffffffffffff48,(size_t)in_stack_ffffffffffffff40,
             (type_bits)in_stack_ffffffffffffff38);
  return;
}

Assistant:

void _set_val(size_t node, csubstr val, type_bits more_flags=0)
    {
        RYML_ASSERT(num_children(node) == 0);
        RYML_ASSERT(!is_seq(node) && !is_map(node));
        _p(node)->m_val.scalar = val;
        _add_flags(node, VAL|more_flags);
    }